

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall
vkb::SwapchainBuilder::add_desired_present_modes
          (SwapchainBuilder *this,vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *modes
          )

{
  iterator iVar1;
  VkPresentModeKHR local_10 [2];
  
  local_10[1] = 1;
  iVar1._M_current =
       (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>(modes,iVar1,local_10 + 1);
  }
  else {
    *iVar1._M_current = VK_PRESENT_MODE_MAILBOX_KHR;
    (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_10[0] = VK_PRESENT_MODE_FIFO_KHR;
  iVar1._M_current =
       (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>(modes,iVar1,local_10);
  }
  else {
    *iVar1._M_current = VK_PRESENT_MODE_FIFO_KHR;
    (modes->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void SwapchainBuilder::add_desired_present_modes(std::vector<VkPresentModeKHR>& modes) const {
    modes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
    modes.push_back(VK_PRESENT_MODE_FIFO_KHR);
}